

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint RemSP::MemMerge(uint i,uint j)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint z_1;
  uint z;
  uint root_j;
  uint root_i;
  uint j_local;
  uint i_local;
  
  z_1 = j;
  z = i;
  while( true ) {
    while( true ) {
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
      uVar1 = *puVar3;
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
      if (uVar1 == *puVar3) {
        puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
        return *puVar3;
      }
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
      uVar1 = *puVar3;
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
      if (uVar1 <= *puVar3) break;
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
      if (z == *puVar3) {
        puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
        uVar1 = *puVar3;
        puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
        *puVar3 = uVar1;
        puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
        return *puVar3;
      }
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
      uVar1 = *puVar3;
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
      uVar2 = *puVar3;
      puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
      *puVar3 = uVar2;
      z = uVar1;
    }
    puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
    if (z_1 == *puVar3) break;
    puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
    uVar1 = *puVar3;
    puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
    uVar2 = *puVar3;
    puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
    *puVar3 = uVar2;
    z_1 = uVar1;
  }
  puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
  uVar1 = *puVar3;
  puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z_1);
  *puVar3 = uVar1;
  puVar3 = MemVector<unsigned_int>::operator[](&mem_P_,z);
  return *puVar3;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);
        while (mem_P_[root_i] != mem_P_[root_j]) {
            if (mem_P_[root_i] > mem_P_[root_j]) {
                if (root_i == mem_P_[root_i]) {
                    mem_P_[root_i] = mem_P_[root_j];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_i];
                mem_P_[root_i] = mem_P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == mem_P_[root_j]) {
                    mem_P_[root_j] = mem_P_[root_i];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_j];
                mem_P_[root_j] = mem_P_[root_i];
                root_j = z;
            }
        }
        return mem_P_[root_i];
    }